

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

void insert_region(int start,int last,REGION_TYPES type,REGIONS *regions,int *num_regions,
                  int *cur_region_idx)

{
  REGION_TYPES RVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  REGIONS *pRVar13;
  REGIONS *pRVar14;
  long lVar15;
  
  iVar10 = *cur_region_idx;
  lVar11 = (long)iVar10;
  RVar1 = regions[lVar11].type;
  iVar2 = regions[lVar11].last;
  uVar12 = (uint)(iVar2 != last) + (uint)(regions[lVar11].start != start);
  iVar3 = *num_regions;
  if (iVar10 < iVar3 + -1) {
    lVar15 = (long)iVar3 + -1;
    pRVar14 = regions + iVar3;
    do {
      pRVar13 = pRVar14 + -1;
      uVar8 = *(undefined4 *)&pRVar14[-1].field_0x34;
      pRVar14[(ulong)uVar12 - 1].type = pRVar14[-1].type;
      *(undefined4 *)&pRVar14[(ulong)uVar12 - 1].field_0x34 = uVar8;
      iVar3 = pRVar13->start;
      iVar9 = pRVar13->last;
      dVar4 = pRVar14[-1].avg_noise_var;
      dVar5 = pRVar14[-1].avg_cor_coeff;
      dVar6 = pRVar14[-1].avg_sr_fr_ratio;
      dVar7 = pRVar14[-1].avg_coded_err;
      pRVar14[(ulong)uVar12 - 1].avg_intra_err = pRVar14[-1].avg_intra_err;
      (&pRVar14[(ulong)uVar12 - 1].avg_intra_err)[1] = dVar7;
      pRVar14[(ulong)uVar12 - 1].avg_cor_coeff = dVar5;
      (&pRVar14[(ulong)uVar12 - 1].avg_cor_coeff)[1] = dVar6;
      pRVar14 = pRVar13 + uVar12;
      pRVar14->start = iVar3;
      pRVar14->last = iVar9;
      pRVar14->avg_noise_var = dVar4;
      lVar15 = lVar15 + -1;
      pRVar14 = pRVar13;
    } while (lVar11 < lVar15);
  }
  *num_regions = *num_regions + uVar12;
  if (regions[lVar11].start < start) {
    regions[lVar11].last = start + -1;
    regions[lVar11 + 1].start = start;
    iVar10 = (int)(lVar11 + 1);
  }
  regions[iVar10].type = type;
  if (last < iVar2) {
    regions[iVar10].last = last;
    iVar10 = iVar10 + 1;
    regions[iVar10].start = last + 1;
    regions[iVar10].last = iVar2;
    regions[iVar10].type = RVar1;
  }
  else {
    regions[iVar10].last = iVar2;
  }
  *cur_region_idx = iVar10;
  return;
}

Assistant:

static void insert_region(int start, int last, REGION_TYPES type,
                          REGIONS *regions, int *num_regions,
                          int *cur_region_idx) {
  int k = *cur_region_idx;
  REGION_TYPES this_region_type = regions[k].type;
  int this_region_last = regions[k].last;
  int num_add = (start != regions[k].start) + (last != regions[k].last);
  // move the following regions further to the back
  for (int r = *num_regions - 1; r > k; r--) {
    regions[r + num_add] = regions[r];
  }
  *num_regions += num_add;
  if (start > regions[k].start) {
    regions[k].last = start - 1;
    k++;
    regions[k].start = start;
  }
  regions[k].type = type;
  if (last < this_region_last) {
    regions[k].last = last;
    k++;
    regions[k].start = last + 1;
    regions[k].last = this_region_last;
    regions[k].type = this_region_type;
  } else {
    regions[k].last = this_region_last;
  }
  *cur_region_idx = k;
}